

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

UTimeZoneNameTypeIndex icu_63::ZNames::getTZNameTypeIndex(UTimeZoneNameType type)

{
  bool bVar1;
  
  if ((int)type < 0x10) {
    switch(type) {
    case UTZNM_LONG_GENERIC:
    case UTZNM_LONG_STANDARD:
      goto switchD_002082ff_caseD_1;
    default:
      return UTZNM_INDEX_UNKNOWN;
    case UTZNM_LONG_DAYLIGHT:
      return UTZNM_INDEX_LONG_DAYLIGHT;
    case UTZNM_SHORT_GENERIC:
      return UTZNM_INDEX_SHORT_GENERIC;
    }
  }
  if (type == UTZNM_SHORT_STANDARD) {
    return UTZNM_INDEX_SHORT_STANDARD;
  }
  if (type == UTZNM_SHORT_DAYLIGHT) {
    return UTZNM_INDEX_SHORT_DAYLIGHT;
  }
  bVar1 = type == UTZNM_EXEMPLAR_LOCATION;
  type = UTZNM_UNKNOWN;
  if (bVar1) {
switchD_002082ff_caseD_1:
    return type;
  }
  return UTZNM_INDEX_UNKNOWN;
}

Assistant:

static UTimeZoneNameTypeIndex getTZNameTypeIndex(UTimeZoneNameType type) {
        switch(type) {
        case UTZNM_EXEMPLAR_LOCATION: return UTZNM_INDEX_EXEMPLAR_LOCATION;
        case UTZNM_LONG_GENERIC: return UTZNM_INDEX_LONG_GENERIC;
        case UTZNM_LONG_STANDARD: return UTZNM_INDEX_LONG_STANDARD;
        case UTZNM_LONG_DAYLIGHT: return UTZNM_INDEX_LONG_DAYLIGHT;
        case UTZNM_SHORT_GENERIC: return UTZNM_INDEX_SHORT_GENERIC;
        case UTZNM_SHORT_STANDARD: return UTZNM_INDEX_SHORT_STANDARD;
        case UTZNM_SHORT_DAYLIGHT: return UTZNM_INDEX_SHORT_DAYLIGHT;
        default: return UTZNM_INDEX_UNKNOWN;
        }
    }